

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_manager.cpp
# Opt level: O1

bool __thiscall
miniros::RPCManager::validateXmlrpcResponse
          (RPCManager *this,string *method,XmlRpcValue *response,XmlRpcValue *payload)

{
  uint uVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  XmlRpcValue *pXVar5;
  bool bVar6;
  string status_string;
  string empty_array;
  XmlRpcValue local_48;
  int offset;
  
  if (response->_type == TypeArray) {
    iVar4 = XmlRpc::XmlRpcValue::size(response);
    if ((iVar4 == 2) || (iVar4 = XmlRpc::XmlRpcValue::size(response), iVar4 == 3)) {
      pXVar5 = XmlRpc::XmlRpcValue::operator[](response,0);
      if (pXVar5->_type == TypeInt) {
        pXVar5 = XmlRpc::XmlRpcValue::operator[](response,0);
        XmlRpc::XmlRpcValue::assertTypeOrInvalid(pXVar5,TypeInt);
        uVar1 = (pXVar5->_value).asInt;
        pXVar5 = XmlRpc::XmlRpcValue::operator[](response,1);
        if (pXVar5->_type == TypeString) {
          pXVar5 = XmlRpc::XmlRpcValue::operator[](response,1);
          XmlRpc::XmlRpcValue::assertTypeOrInvalid(pXVar5,TypeString);
          pcVar2 = (((pXVar5->_value).asBinary)->super__Vector_base<char,_std::allocator<char>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          status_string._M_dataplus._M_p = (pointer)&status_string.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&status_string,pcVar2,
                     (((pXVar5->_value).asBinary)->super__Vector_base<char,_std::allocator<char>_>).
                     _M_impl.super__Vector_impl_data._M_finish + (long)pcVar2);
          bVar6 = uVar1 == 1;
          if (bVar6) {
            iVar4 = XmlRpc::XmlRpcValue::size(response);
            if (iVar4 < 3) {
              empty_array._M_dataplus._M_p = (pointer)&empty_array.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&empty_array,"<value><array><data></data></array></value>","");
              offset = 0;
              local_48._type = TypeInvalid;
              bVar3 = XmlRpc::XmlRpcValue::fromXml(&local_48,&empty_array,&offset);
              if (!bVar3) {
                local_48._type = TypeInvalid;
              }
              XmlRpc::XmlRpcValue::operator=(payload,&local_48);
              XmlRpc::XmlRpcValue::invalidate(&local_48);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)empty_array._M_dataplus._M_p != &empty_array.field_2) {
                operator_delete(empty_array._M_dataplus._M_p,
                                empty_array.field_2._M_allocated_capacity + 1);
              }
            }
            else {
              pXVar5 = XmlRpc::XmlRpcValue::operator[](response,2);
              XmlRpc::XmlRpcValue::operator=(payload,pXVar5);
            }
          }
          else {
            if (console::g_initialized == '\0') {
              console::initialize();
            }
            if (validateXmlrpcResponse(std::__cxx11::string_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&)
                ::loc.initialized_ == false) {
              empty_array._M_dataplus._M_p = (pointer)&empty_array.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&empty_array,"miniros.RPCManager","");
              console::initializeLogLocation
                        (&validateXmlrpcResponse(std::__cxx11::string_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&)
                          ::loc,&empty_array,Debug);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)empty_array._M_dataplus._M_p != &empty_array.field_2) {
                operator_delete(empty_array._M_dataplus._M_p,
                                empty_array.field_2._M_allocated_capacity + 1);
              }
            }
            if (validateXmlrpcResponse(std::__cxx11::string_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&)
                ::loc.level_ != Debug) {
              console::setLogLocationLevel
                        (&validateXmlrpcResponse(std::__cxx11::string_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&)
                          ::loc,Debug);
              console::checkLogLocationEnabled
                        (&validateXmlrpcResponse(std::__cxx11::string_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&)
                          ::loc);
            }
            if (validateXmlrpcResponse(std::__cxx11::string_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&)
                ::loc.logger_enabled_ == true) {
              console::print((FilterBase *)0x0,
                             validateXmlrpcResponse(std::__cxx11::string_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&)
                             ::loc.logger_,
                             validateXmlrpcResponse(std::__cxx11::string_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&)
                             ::loc.level_,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/rpc_manager.cpp"
                             ,0xf5,
                             "bool miniros::RPCManager::validateXmlrpcResponse(const std::string &, XmlRpcValue &, XmlRpcValue &)"
                             ,"XML-RPC call [%s] returned an error (%d): [%s]",
                             (method->_M_dataplus)._M_p,(ulong)uVar1,status_string._M_dataplus._M_p)
              ;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)status_string._M_dataplus._M_p == &status_string.field_2) {
            return bVar6;
          }
          operator_delete(status_string._M_dataplus._M_p,
                          status_string.field_2._M_allocated_capacity + 1);
          return bVar6;
        }
        if (console::g_initialized == '\0') {
          console::initialize();
        }
        if (validateXmlrpcResponse(std::__cxx11::string_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&)
            ::loc.initialized_ == false) {
          status_string._M_dataplus._M_p = (pointer)&status_string.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&status_string,"miniros.RPCManager","");
          console::initializeLogLocation
                    (&validateXmlrpcResponse(std::__cxx11::string_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&)
                      ::loc,&status_string,Debug);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)status_string._M_dataplus._M_p != &status_string.field_2) {
            operator_delete(status_string._M_dataplus._M_p,
                            status_string.field_2._M_allocated_capacity + 1);
          }
        }
        if (validateXmlrpcResponse(std::__cxx11::string_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&)
            ::loc.level_ != Debug) {
          validateXmlrpcResponse();
        }
        if (validateXmlrpcResponse(std::__cxx11::string_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&)
            ::loc.logger_enabled_ == true) {
          validateXmlrpcResponse((RPCManager *)method);
        }
      }
      else {
        if (console::g_initialized == '\0') {
          console::initialize();
        }
        if (validateXmlrpcResponse(std::__cxx11::string_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&)
            ::loc.initialized_ == false) {
          status_string._M_dataplus._M_p = (pointer)&status_string.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&status_string,"miniros.RPCManager","");
          console::initializeLogLocation
                    (&validateXmlrpcResponse(std::__cxx11::string_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&)
                      ::loc,&status_string,Debug);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)status_string._M_dataplus._M_p != &status_string.field_2) {
            operator_delete(status_string._M_dataplus._M_p,
                            status_string.field_2._M_allocated_capacity + 1);
          }
        }
        if (validateXmlrpcResponse(std::__cxx11::string_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&)
            ::loc.level_ != Debug) {
          validateXmlrpcResponse();
        }
        if (validateXmlrpcResponse(std::__cxx11::string_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&)
            ::loc.logger_enabled_ == true) {
          validateXmlrpcResponse((RPCManager *)method);
        }
      }
    }
    else {
      if (console::g_initialized == '\0') {
        console::initialize();
      }
      if (validateXmlrpcResponse(std::__cxx11::string_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&)
          ::loc.initialized_ == false) {
        status_string._M_dataplus._M_p = (pointer)&status_string.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&status_string,"miniros.RPCManager","");
        console::initializeLogLocation
                  (&validateXmlrpcResponse(std::__cxx11::string_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&)
                    ::loc,&status_string,Debug);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)status_string._M_dataplus._M_p != &status_string.field_2) {
          operator_delete(status_string._M_dataplus._M_p,
                          status_string.field_2._M_allocated_capacity + 1);
        }
      }
      if (validateXmlrpcResponse(std::__cxx11::string_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&)
          ::loc.level_ != Debug) {
        validateXmlrpcResponse();
      }
      if (validateXmlrpcResponse(std::__cxx11::string_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&)
          ::loc.logger_enabled_ == true) {
        validateXmlrpcResponse((RPCManager *)method);
      }
    }
  }
  else {
    if (console::g_initialized == '\0') {
      console::initialize();
    }
    if (validateXmlrpcResponse::loc.initialized_ == false) {
      status_string._M_dataplus._M_p = (pointer)&status_string.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&status_string,"miniros.RPCManager","");
      console::initializeLogLocation(&validateXmlrpcResponse::loc,&status_string,Debug);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)status_string._M_dataplus._M_p != &status_string.field_2) {
        operator_delete(status_string._M_dataplus._M_p,
                        status_string.field_2._M_allocated_capacity + 1);
      }
    }
    if (validateXmlrpcResponse::loc.level_ != Debug) {
      validateXmlrpcResponse();
    }
    if (validateXmlrpcResponse::loc.logger_enabled_ == true) {
      validateXmlrpcResponse((RPCManager *)method);
    }
  }
  return false;
}

Assistant:

bool RPCManager::validateXmlrpcResponse(const std::string& method, XmlRpcValue &response,
                                    XmlRpcValue &payload)
{
  if (response.getType() != XmlRpcValue::TypeArray)
  {
    MINIROS_DEBUG("XML-RPC call [%s] didn't return an array",
        method.c_str());
    return false;
  }
  if (response.size() != 2 && response.size() != 3)
  {
    MINIROS_DEBUG("XML-RPC call [%s] didn't return a 2 or 3-element array",
        method.c_str());
    return false;
  }
  if (response[0].getType() != XmlRpcValue::TypeInt)
  {
    MINIROS_DEBUG("XML-RPC call [%s] didn't return a int as the 1st element",
        method.c_str());
    return false;
  }
  int status_code = response[0];
  if (response[1].getType() != XmlRpcValue::TypeString)
  {
    MINIROS_DEBUG("XML-RPC call [%s] didn't return a string as the 2nd element",
        method.c_str());
    return false;
  }
  std::string status_string = response[1];
  if (status_code != 1)
  {
    MINIROS_DEBUG("XML-RPC call [%s] returned an error (%d): [%s]",
        method.c_str(), status_code, status_string.c_str());
    return false;
  }
  if (response.size() > 2)
  {
    payload = response[2];
  }
  else
  {
    std::string empty_array = "<value><array><data></data></array></value>";
    int offset = 0;
    payload = XmlRpcValue(empty_array, &offset);
  }
  return true;
}